

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# pzshapeprism.cpp
# Opt level: O0

int pzshape::TPZShapePrism::NConnectShapeF(int side,int order)

{
  ostream *this;
  void *this_00;
  int in_ESI;
  int in_EDI;
  int local_4;
  
  if (in_EDI < 6) {
    local_4 = 1;
  }
  else if (in_EDI < 0xf) {
    local_4 = in_ESI + -1;
  }
  else if ((in_EDI == 0xf) || (in_EDI == 0x13)) {
    local_4 = ((in_ESI + -2) * (in_ESI + -1)) / 2;
  }
  else if ((in_EDI < 0x10) || (0x12 < in_EDI)) {
    if (in_EDI == 0x14) {
      local_4 = ((in_ESI + -2) * (in_ESI + -1) * (in_ESI + -1)) / 2;
    }
    else {
      this = std::operator<<((ostream *)&std::cerr,
                             "TPZShapePrism::NConnectShapeF, bad parameter side ");
      this_00 = (void *)std::ostream::operator<<(this,in_EDI);
      std::ostream::operator<<(this_00,std::endl<char,std::char_traits<char>>);
      local_4 = 0;
    }
  }
  else {
    local_4 = (in_ESI + -1) * (in_ESI + -1);
  }
  return local_4;
}

Assistant:

int TPZShapePrism::NConnectShapeF(int side, int order) {
		if(side<6) return 1;//0 a 4
		if(side<15) return (order-1);//6 a 14
		if(side==15 || side==19) {
			return ((order-2)*(order-1)/2);
		}
		if(side>15 && side<19) {//16,17,18
			return ((order-1)*(order-1));
		}
		if(side==20) {
			return ((order-2)*(order-1)*(order-1)/2);
		}
		PZError << "TPZShapePrism::NConnectShapeF, bad parameter side " << side << endl;
		return 0;
	}